

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.cpp
# Opt level: O0

DGNodeArtificial * __thiscall dg::sdg::DGFormalParameters::createVarArg(DGFormalParameters *this)

{
  DependenceGraph *this_00;
  type pDVar1;
  DGParameters *in_RDI;
  DependenceGraph *dg;
  pointer in_stack_ffffffffffffffd8;
  DGParameters *this_01;
  
  this_00 = DGParameters::getDG(in_RDI);
  this_01 = in_RDI + 1;
  DependenceGraph::createArtificial(this_00);
  std::unique_ptr<dg::sdg::DGNodeArtificial,_std::default_delete<dg::sdg::DGNodeArtificial>_>::reset
            ((unique_ptr<dg::sdg::DGNodeArtificial,_std::default_delete<dg::sdg::DGNodeArtificial>_>
              *)this_01,in_stack_ffffffffffffffd8);
  pDVar1 = std::
           unique_ptr<dg::sdg::DGNodeArtificial,_std::default_delete<dg::sdg::DGNodeArtificial>_>::
           operator*((unique_ptr<dg::sdg::DGNodeArtificial,_std::default_delete<dg::sdg::DGNodeArtificial>_>
                      *)this_01);
  return pDVar1;
}

Assistant:

DGNodeArtificial &DGFormalParameters::createVarArg() {
    auto &dg = getDG();
    _vararg.reset(&dg.createArtificial());
    return *_vararg;
}